

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::ProgramInputOutputReferencedByCase::init
          (ProgramInputOutputReferencedByCase *this,EVP_PKEY_CTX *ctx)

{
  Storage SVar1;
  Storage storage_;
  ShaderType type;
  bool bVar2;
  bool bVar3;
  ContextType CVar4;
  GLSLVersion version;
  CaseType CVar5;
  int extraout_EAX;
  Program *this_00;
  Shader *pSVar6;
  Shader *pSVar7;
  undefined7 extraout_var;
  NotSupportedError *pNVar8;
  char *__s;
  allocator<char> local_141;
  string local_140;
  VarType local_120;
  Layout local_104;
  VariableDeclaration targetDecl;
  VariableDeclaration targetDeclArr;
  
  CVar5 = this->m_caseType;
  CVar4.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(CVar4,(ApiType)0x23);
  if ((((CVar5 < CASE_LAST) && ((0x73U >> ((byte)CVar5 & 0x1f) & 1) == 0)) && (!bVar2)) &&
     (bVar3 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_EXT_tessellation_shader"), !bVar3)) {
    pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetDecl,"Test requires GL_EXT_tessellation_shader extension",
               (allocator<char> *)&targetDeclArr);
    tcu::NotSupportedError::NotSupportedError(pNVar8,(string *)&targetDecl);
    __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (((CVar5 < CASE_SEPARABLE_TESS_CTRL && (0x35U >> ((byte)CVar5 & 0x1f) & 1) == 0) && !bVar2) &&
     (bVar2 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_geometry_shader")
     , !bVar2)) {
    pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetDecl,"Test requires GL_EXT_geometry_shader extension",
               (allocator<char> *)&targetDeclArr);
    tcu::NotSupportedError::NotSupportedError(pNVar8,(string *)&targetDecl);
    __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  CVar4.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(CVar4);
  this_00 = (Program *)operator_new(0x48);
  ProgramInterfaceDefinition::Program::Program(this_00);
  this->m_program = this_00;
  if (this->m_caseType - CASE_SEPARABLE_VERTEX < 5) {
    __s = "shaderOutput";
    SVar1 = this->m_targetStorage;
    if (SVar1 == STORAGE_PATCH_IN) {
      __s = "shaderInput";
    }
    if (SVar1 == STORAGE_IN) {
      __s = "shaderInput";
    }
    glu::VarType::VarType((VarType *)&local_140,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetDeclArr,__s,(allocator<char> *)&local_104);
    storage_ = this->m_targetStorage;
    glu::Layout::Layout((Layout *)&local_120,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&targetDecl,(VarType *)&local_140,(string *)&targetDeclArr,storage_,
               INTERPOLATION_LAST,(Layout *)&local_120,0);
    std::__cxx11::string::~string((string *)&targetDeclArr);
    glu::VarType::~VarType((VarType *)&local_140);
    CVar5 = this->m_caseType;
    type = (CVar5 != CASE_SEPARABLE_TESS_EVAL) + 4 + (uint)(CVar5 != CASE_SEPARABLE_TESS_EVAL);
    if (CVar5 - SHADERTYPE_TESSELLATION_EVALUATION < SHADERTYPE_TESSELLATION_EVALUATION) {
      type = CVar5 - SHADERTYPE_TESSELLATION_EVALUATION;
    }
    if ((SVar1 == STORAGE_PATCH_IN) || (SVar1 == STORAGE_IN)) {
      bVar2 = (type & SHADERTYPE_LAST) == SHADERTYPE_GEOMETRY || CVar5 == CASE_SEPARABLE_TESS_EVAL;
    }
    else {
      bVar2 = type == SHADERTYPE_TESSELLATION_CONTROL;
    }
    ProgramInterfaceDefinition::Program::setSeparable(this->m_program,true);
    if ((bool)(bVar2 & SVar1 - STORAGE_LAST < 0xfffffffe)) {
      glu::VarType::VarType(&local_120,&targetDecl.varType,-1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,__s,&local_141);
      SVar1 = this->m_targetStorage;
      glu::Layout::Layout(&local_104,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      glu::VariableDeclaration::VariableDeclaration
                (&targetDeclArr,&local_120,&local_140,SVar1,INTERPOLATION_LAST,&local_104,0);
      std::__cxx11::string::~string((string *)&local_140);
      glu::VarType::~VarType(&local_120);
      pSVar7 = ProgramInterfaceDefinition::Program::addShader(this->m_program,type,version);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
                (&(pSVar7->m_defaultBlock).variables,&targetDeclArr);
      glu::VariableDeclaration::~VariableDeclaration(&targetDeclArr);
    }
    else {
      pSVar7 = ProgramInterfaceDefinition::Program::addShader(this->m_program,type,version);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
                (&(pSVar7->m_defaultBlock).variables,&targetDecl);
    }
    glu::VariableDeclaration::~VariableDeclaration(&targetDecl);
  }
  else if (this->m_caseType < CASE_SEPARABLE_VERTEX) {
    pSVar7 = ProgramInterfaceDefinition::Program::addShader(this_00,SHADERTYPE_VERTEX,version);
    pSVar6 = ProgramInterfaceDefinition::Program::addShader
                       (this->m_program,SHADERTYPE_FRAGMENT,version);
    ProgramInterfaceDefinition::Program::setSeparable(this->m_program,false);
    glu::VarType::VarType((VarType *)&local_140,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetDeclArr,"shaderInput",(allocator<char> *)&local_104);
    glu::Layout::Layout((Layout *)&local_120,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&targetDecl,(VarType *)&local_140,(string *)&targetDeclArr,STORAGE_IN,
               INTERPOLATION_LAST,(Layout *)&local_120,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
    emplace_back<glu::VariableDeclaration>(&(pSVar7->m_defaultBlock).variables,&targetDecl);
    glu::VariableDeclaration::~VariableDeclaration(&targetDecl);
    std::__cxx11::string::~string((string *)&targetDeclArr);
    glu::VarType::~VarType((VarType *)&local_140);
    glu::VarType::VarType((VarType *)&local_140,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetDeclArr,"shaderOutput",(allocator<char> *)&local_104);
    glu::Layout::Layout((Layout *)&local_120,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&targetDecl,(VarType *)&local_140,(string *)&targetDeclArr,STORAGE_OUT,
               INTERPOLATION_LAST,(Layout *)&local_120,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
    emplace_back<glu::VariableDeclaration>(&(pSVar7->m_defaultBlock).variables,&targetDecl);
    glu::VariableDeclaration::~VariableDeclaration(&targetDecl);
    std::__cxx11::string::~string((string *)&targetDeclArr);
    glu::VarType::~VarType((VarType *)&local_140);
    glu::VarType::VarType((VarType *)&local_140,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetDeclArr,"shaderOutput",(allocator<char> *)&local_104);
    glu::Layout::Layout((Layout *)&local_120,0,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&targetDecl,(VarType *)&local_140,(string *)&targetDeclArr,STORAGE_OUT,
               INTERPOLATION_LAST,(Layout *)&local_120,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
    emplace_back<glu::VariableDeclaration>(&(pSVar6->m_defaultBlock).variables,&targetDecl);
    glu::VariableDeclaration::~VariableDeclaration(&targetDecl);
    std::__cxx11::string::~string((string *)&targetDeclArr);
    glu::VarType::~VarType((VarType *)&local_140);
    glu::VarType::VarType((VarType *)&local_140,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetDeclArr,"shaderInput",(allocator<char> *)&local_104);
    glu::Layout::Layout((Layout *)&local_120,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&targetDecl,(VarType *)&local_140,(string *)&targetDeclArr,STORAGE_IN,
               INTERPOLATION_LAST,(Layout *)&local_120,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
    emplace_back<glu::VariableDeclaration>(&(pSVar6->m_defaultBlock).variables,&targetDecl);
    glu::VariableDeclaration::~VariableDeclaration(&targetDecl);
    std::__cxx11::string::~string((string *)&targetDeclArr);
    glu::VarType::~VarType((VarType *)&local_140);
    CVar5 = this->m_caseType;
    if ((CVar5 & ~CASE_VERTEX_GEO_FRAGMENT) == CASE_VERTEX_TESS_FRAGMENT) {
      pSVar7 = ProgramInterfaceDefinition::Program::addShader
                         (this->m_program,SHADERTYPE_TESSELLATION_CONTROL,version);
      pSVar6 = ProgramInterfaceDefinition::Program::addShader
                         (this->m_program,SHADERTYPE_TESSELLATION_EVALUATION,version);
      glu::VarType::VarType(&local_120,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
      glu::VarType::VarType((VarType *)&local_140,&local_120,-1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&targetDeclArr,"shaderInput",&local_141);
      glu::Layout::Layout(&local_104,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      glu::VariableDeclaration::VariableDeclaration
                (&targetDecl,(VarType *)&local_140,(string *)&targetDeclArr,STORAGE_IN,
                 INTERPOLATION_LAST,&local_104,0);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
      emplace_back<glu::VariableDeclaration>(&(pSVar7->m_defaultBlock).variables,&targetDecl);
      glu::VariableDeclaration::~VariableDeclaration(&targetDecl);
      std::__cxx11::string::~string((string *)&targetDeclArr);
      glu::VarType::~VarType((VarType *)&local_140);
      glu::VarType::~VarType(&local_120);
      glu::VarType::VarType(&local_120,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
      glu::VarType::VarType((VarType *)&local_140,&local_120,-1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&targetDeclArr,"shaderOutput",&local_141);
      glu::Layout::Layout(&local_104,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      glu::VariableDeclaration::VariableDeclaration
                (&targetDecl,(VarType *)&local_140,(string *)&targetDeclArr,STORAGE_OUT,
                 INTERPOLATION_LAST,&local_104,0);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
      emplace_back<glu::VariableDeclaration>(&(pSVar7->m_defaultBlock).variables,&targetDecl);
      glu::VariableDeclaration::~VariableDeclaration(&targetDecl);
      std::__cxx11::string::~string((string *)&targetDeclArr);
      glu::VarType::~VarType((VarType *)&local_140);
      glu::VarType::~VarType(&local_120);
      glu::VarType::VarType(&local_120,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
      glu::VarType::VarType((VarType *)&local_140,&local_120,-1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&targetDeclArr,"shaderInput",&local_141);
      glu::Layout::Layout(&local_104,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      glu::VariableDeclaration::VariableDeclaration
                (&targetDecl,(VarType *)&local_140,(string *)&targetDeclArr,STORAGE_IN,
                 INTERPOLATION_LAST,&local_104,0);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
      emplace_back<glu::VariableDeclaration>(&(pSVar6->m_defaultBlock).variables,&targetDecl);
      glu::VariableDeclaration::~VariableDeclaration(&targetDecl);
      std::__cxx11::string::~string((string *)&targetDeclArr);
      glu::VarType::~VarType((VarType *)&local_140);
      glu::VarType::~VarType(&local_120);
      glu::VarType::VarType((VarType *)&local_140,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&targetDeclArr,"shaderOutput",(allocator<char> *)&local_104);
      glu::Layout::Layout((Layout *)&local_120,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      glu::VariableDeclaration::VariableDeclaration
                (&targetDecl,(VarType *)&local_140,(string *)&targetDeclArr,STORAGE_OUT,
                 INTERPOLATION_LAST,(Layout *)&local_120,0);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
      emplace_back<glu::VariableDeclaration>(&(pSVar6->m_defaultBlock).variables,&targetDecl);
      glu::VariableDeclaration::~VariableDeclaration(&targetDecl);
      std::__cxx11::string::~string((string *)&targetDeclArr);
      glu::VarType::~VarType((VarType *)&local_140);
      CVar5 = this->m_caseType;
    }
    if ((CVar5 | CASE_VERTEX_TESS_FRAGMENT) == CASE_VERTEX_TESS_GEO_FRAGMENT) {
      pSVar7 = ProgramInterfaceDefinition::Program::addShader
                         (this->m_program,SHADERTYPE_GEOMETRY,version);
      glu::VarType::VarType(&local_120,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
      glu::VarType::VarType((VarType *)&local_140,&local_120,-1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&targetDeclArr,"shaderInput",&local_141);
      glu::Layout::Layout(&local_104,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      glu::VariableDeclaration::VariableDeclaration
                (&targetDecl,(VarType *)&local_140,(string *)&targetDeclArr,STORAGE_IN,
                 INTERPOLATION_LAST,&local_104,0);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
      emplace_back<glu::VariableDeclaration>(&(pSVar7->m_defaultBlock).variables,&targetDecl);
      glu::VariableDeclaration::~VariableDeclaration(&targetDecl);
      std::__cxx11::string::~string((string *)&targetDeclArr);
      glu::VarType::~VarType((VarType *)&local_140);
      glu::VarType::~VarType(&local_120);
      glu::VarType::VarType((VarType *)&local_140,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&targetDeclArr,"shaderOutput",(allocator<char> *)&local_104);
      glu::Layout::Layout((Layout *)&local_120,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      glu::VariableDeclaration::VariableDeclaration
                (&targetDecl,(VarType *)&local_140,(string *)&targetDeclArr,STORAGE_OUT,
                 INTERPOLATION_LAST,(Layout *)&local_120,0);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
      emplace_back<glu::VariableDeclaration>(&(pSVar7->m_defaultBlock).variables,&targetDecl);
      glu::VariableDeclaration::~VariableDeclaration(&targetDecl);
      std::__cxx11::string::~string((string *)&targetDeclArr);
      glu::VarType::~VarType((VarType *)&local_140);
    }
  }
  bVar2 = ProgramInterfaceDefinition::Program::hasStage(this->m_program,SHADERTYPE_GEOMETRY);
  if (bVar2) {
    ProgramInterfaceDefinition::Program::setGeometryNumOutputVertices(this->m_program,1);
  }
  bVar2 = ProgramInterfaceDefinition::Program::hasStage
                    (this->m_program,SHADERTYPE_TESSELLATION_CONTROL);
  if (!bVar2) {
    bVar2 = ProgramInterfaceDefinition::Program::hasStage
                      (this->m_program,SHADERTYPE_TESSELLATION_EVALUATION);
    if (!bVar2) {
      return (int)CONCAT71(extraout_var,bVar2);
    }
  }
  ProgramInterfaceDefinition::Program::setTessellationNumOutputPatchVertices(this->m_program,1);
  return extraout_EAX;
}

Assistant:

void ProgramInputOutputReferencedByCase::init (void)
{
	const bool hasTessellationShader =	(m_caseType == CASE_VERTEX_TESS_FRAGMENT)		||
										(m_caseType == CASE_VERTEX_TESS_GEO_FRAGMENT)	||
										(m_caseType == CASE_SEPARABLE_TESS_CTRL)		||
										(m_caseType == CASE_SEPARABLE_TESS_EVAL);
	const bool hasGeometryShader =		(m_caseType == CASE_VERTEX_GEO_FRAGMENT)		||
										(m_caseType == CASE_VERTEX_TESS_GEO_FRAGMENT)	||
										(m_caseType == CASE_SEPARABLE_GEOMETRY);
	const bool supportsES32 =			glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (hasTessellationShader && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");
	if (hasGeometryShader && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_geometry_shader extension");

	glu::GLSLVersion glslVersion = glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
	m_program = new ProgramInterfaceDefinition::Program();

	if (m_caseType == CASE_SEPARABLE_VERTEX		||
		m_caseType == CASE_SEPARABLE_FRAGMENT	||
		m_caseType == CASE_SEPARABLE_GEOMETRY	||
		m_caseType == CASE_SEPARABLE_TESS_CTRL	||
		m_caseType == CASE_SEPARABLE_TESS_EVAL)
	{
		const bool						isInputCase			= (m_targetStorage == glu::STORAGE_IN || m_targetStorage == glu::STORAGE_PATCH_IN);
		const bool						perPatchStorage		= (m_targetStorage == glu::STORAGE_PATCH_IN || m_targetStorage == glu::STORAGE_PATCH_OUT);
		const char*						varName				= (isInputCase) ? ("shaderInput") : ("shaderOutput");
		const glu::VariableDeclaration	targetDecl			(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), varName, m_targetStorage);
		const glu::ShaderType			shaderType			= (m_caseType == CASE_SEPARABLE_VERTEX)		? (glu::SHADERTYPE_VERTEX)
															: (m_caseType == CASE_SEPARABLE_FRAGMENT)	? (glu::SHADERTYPE_FRAGMENT)
															: (m_caseType == CASE_SEPARABLE_GEOMETRY)	? (glu::SHADERTYPE_GEOMETRY)
															: (m_caseType == CASE_SEPARABLE_TESS_CTRL)	? (glu::SHADERTYPE_TESSELLATION_CONTROL)
															: (m_caseType == CASE_SEPARABLE_TESS_EVAL)	? (glu::SHADERTYPE_TESSELLATION_EVALUATION)
															:											  (glu::SHADERTYPE_LAST);
		const bool						arrayedInterface	= (isInputCase) ? ((shaderType == glu::SHADERTYPE_GEOMETRY)					||
																			   (shaderType == glu::SHADERTYPE_TESSELLATION_CONTROL)		||
																			   (shaderType == glu::SHADERTYPE_TESSELLATION_EVALUATION))
																			: (shaderType == glu::SHADERTYPE_TESSELLATION_CONTROL);

		m_program->setSeparable(true);

		if (arrayedInterface && !perPatchStorage)
		{
			const glu::VariableDeclaration targetDeclArr(glu::VarType(targetDecl.varType, glu::VarType::UNSIZED_ARRAY), varName, m_targetStorage);
			m_program->addShader(shaderType, glslVersion)->getDefaultBlock().variables.push_back(targetDeclArr);
		}
		else
		{
			m_program->addShader(shaderType, glslVersion)->getDefaultBlock().variables.push_back(targetDecl);
		}
	}
	else if (m_caseType == CASE_VERTEX_FRAGMENT			||
			 m_caseType == CASE_VERTEX_GEO_FRAGMENT		||
			 m_caseType == CASE_VERTEX_TESS_FRAGMENT	||
			 m_caseType == CASE_VERTEX_TESS_GEO_FRAGMENT)
	{
		ProgramInterfaceDefinition::Shader*	vertex		= m_program->addShader(glu::SHADERTYPE_VERTEX, glslVersion);
		ProgramInterfaceDefinition::Shader*	fragment	= m_program->addShader(glu::SHADERTYPE_FRAGMENT, glslVersion);

		m_program->setSeparable(false);

		vertex->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP),
																			   "shaderInput",
																			   glu::STORAGE_IN));
		vertex->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP),
																			   "shaderOutput",
																			   glu::STORAGE_OUT,
																			   glu::INTERPOLATION_LAST,
																			   glu::Layout(1)));

		fragment->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP),
																				 "shaderOutput",
																				 glu::STORAGE_OUT,
																				 glu::INTERPOLATION_LAST,
																				 glu::Layout(0)));
		fragment->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP),
																				 "shaderInput",
																				 glu::STORAGE_IN,
																				 glu::INTERPOLATION_LAST,
																				 glu::Layout(1)));

		if (m_caseType == CASE_VERTEX_TESS_FRAGMENT || m_caseType == CASE_VERTEX_TESS_GEO_FRAGMENT)
		{
			ProgramInterfaceDefinition::Shader* tessCtrl = m_program->addShader(glu::SHADERTYPE_TESSELLATION_CONTROL, glslVersion);
			ProgramInterfaceDefinition::Shader* tessEval = m_program->addShader(glu::SHADERTYPE_TESSELLATION_EVALUATION, glslVersion);

			tessCtrl->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), glu::VarType::UNSIZED_ARRAY),
																					 "shaderInput",
																					 glu::STORAGE_IN,
																					 glu::INTERPOLATION_LAST,
																					 glu::Layout(1)));
			tessCtrl->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), glu::VarType::UNSIZED_ARRAY),
																					 "shaderOutput",
																					 glu::STORAGE_OUT,
																					 glu::INTERPOLATION_LAST,
																					 glu::Layout(1)));

			tessEval->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), glu::VarType::UNSIZED_ARRAY),
																					 "shaderInput",
																					 glu::STORAGE_IN,
																					 glu::INTERPOLATION_LAST,
																					 glu::Layout(1)));
			tessEval->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP),
																					 "shaderOutput",
																					 glu::STORAGE_OUT,
																					 glu::INTERPOLATION_LAST,
																					 glu::Layout(1)));
		}

		if (m_caseType == CASE_VERTEX_GEO_FRAGMENT || m_caseType == CASE_VERTEX_TESS_GEO_FRAGMENT)
		{
			ProgramInterfaceDefinition::Shader* geometry = m_program->addShader(glu::SHADERTYPE_GEOMETRY, glslVersion);

			geometry->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), glu::VarType::UNSIZED_ARRAY),
																					 "shaderInput",
																					 glu::STORAGE_IN,
																					 glu::INTERPOLATION_LAST,
																					 glu::Layout(1)));
			geometry->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP),
																					 "shaderOutput",
																					 glu::STORAGE_OUT,
																					 glu::INTERPOLATION_LAST,
																					 glu::Layout(1)));
		}
	}
	else
		DE_ASSERT(false);

	if (m_program->hasStage(glu::SHADERTYPE_GEOMETRY))
		m_program->setGeometryNumOutputVertices(1);
	if (m_program->hasStage(glu::SHADERTYPE_TESSELLATION_CONTROL) || m_program->hasStage(glu::SHADERTYPE_TESSELLATION_EVALUATION))
		m_program->setTessellationNumOutputPatchVertices(1);

	DE_ASSERT(m_program->isValid());
}